

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentPtr::ClearSavedSubdivisionPoints(ON_SubDComponentPtr *this,bool bClearNeighborhood)

{
  uint uVar1;
  ON_SubDVertex *this_00;
  ON_SubDEdge *this_01;
  ON_SubDFace *this_02;
  ON_SubDFace *f;
  ON_SubDEdge *e;
  ON_SubDVertex *v;
  bool bClearNeighborhood_local;
  ON_SubDComponentPtr *this_local;
  
  uVar1 = (uint)this->m_ptr & 6;
  if (uVar1 == 2) {
    this_00 = Vertex(this);
    if (this_00 != (ON_SubDVertex *)0x0) {
      ON_SubDVertex::ClearSavedSubdivisionPoints(this_00,bClearNeighborhood);
    }
  }
  else if (uVar1 == 4) {
    this_01 = Edge(this);
    if (this_01 != (ON_SubDEdge *)0x0) {
      ON_SubDEdge::ClearSavedSubdivisionPoints(this_01,bClearNeighborhood);
    }
  }
  else if ((uVar1 == 6) && (this_02 = Face(this), this_02 != (ON_SubDFace *)0x0)) {
    ON_SubDFace::ClearSavedSubdivisionPoints(this_02,bClearNeighborhood);
  }
  return;
}

Assistant:

void ON_SubDComponentPtr::ClearSavedSubdivisionPoints(
  bool bClearNeighborhood
) const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  {
    const ON_SubDVertex* v = Vertex();
    if (nullptr != v)
      v->ClearSavedSubdivisionPoints(bClearNeighborhood);
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  {
    const ON_SubDEdge* e = Edge();
    if (nullptr != e)
      e->ClearSavedSubdivisionPoints(bClearNeighborhood);
  }
  break;
  case ON_SUBD_COMPONENT_TYPE_FACE:
  {
    const ON_SubDFace* f = Face();
    if (nullptr != f)
      f->ClearSavedSubdivisionPoints(bClearNeighborhood);
  }
  break;
  }
}